

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_option_nodump.c
# Opt level: O2

void test_option_nodump(void)

{
  wchar_t wVar1;
  
  wVar1 = canNodump();
  if (wVar1 != L'\0') {
    assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_nodump.c"
                        ,L'\x11',"file1",L'Ƥ',L'\xffffffff',"file1");
    assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_nodump.c"
                        ,L'\x12',"file2",L'Ƥ',L'\xffffffff',"file2");
    assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_nodump.c"
                        ,L'\x13',"file3",L'Ƥ',L'\xffffffff',"file3");
    assertion_set_nodump
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_nodump.c"
               ,L'\x14',"file2");
    wVar1 = systemf("%s -cf test1.tar file1 file2 file3",testprog);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_nodump.c"
                        ,L'\x18',0,"0",(long)wVar1,
                        "systemf(\"%s -cf test1.tar file1 file2 file3\", testprog)",(void *)0x0);
    assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_nodump.c"
                       ,L'\x19',"test1",L'ǭ');
    assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_nodump.c"
                    ,L'\x1a',"test1");
    wVar1 = systemf("%s -xf ../test1.tar >test.out 2>test.err",testprog);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_nodump.c"
                        ,L'\x1c',0,"0",(long)wVar1,
                        "systemf(\"%s -xf ../test1.tar >test.out 2>test.err\", testprog)",
                        (void *)0x0);
    assertion_file_contents
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_nodump.c"
               ,L'\x1d',"file1",L'\x05',"file1");
    assertion_file_contents
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_nodump.c"
               ,L'\x1e',"file2",L'\x05',"file2");
    assertion_file_contents
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_nodump.c"
               ,L'\x1f',"file3",L'\x05',"file3");
    assertion_empty_file
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_nodump.c"
               ,L' ',"test.out");
    assertion_empty_file
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_nodump.c"
               ,L'!',"test.err");
    assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_nodump.c"
                    ,L'\"',"..");
    wVar1 = systemf("%s -cf test2.tar --nodump file1 file2 file3",testprog);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_nodump.c"
                        ,L'&',0,"0",(long)wVar1,
                        "systemf(\"%s -cf test2.tar --nodump file1 file2 file3\", testprog)",
                        (void *)0x0);
    assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_nodump.c"
                       ,L'\'',"test2",L'ǭ');
    assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_nodump.c"
                    ,L'(',"test2");
    wVar1 = systemf("%s -xf ../test2.tar >test.out 2>test.err",testprog);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_nodump.c"
                        ,L'*',0,"0",(long)wVar1,
                        "systemf(\"%s -xf ../test2.tar >test.out 2>test.err\", testprog)",
                        (void *)0x0);
    assertion_file_contents
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_nodump.c"
               ,L'+',"file1",L'\x05',"file1");
    assertion_file_not_exists
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_nodump.c"
               ,L',',"file2");
    assertion_file_contents
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_nodump.c"
               ,L'-',"file3",L'\x05',"file3");
    assertion_empty_file
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_nodump.c"
               ,L'.',"test.out");
    assertion_empty_file
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_nodump.c"
               ,L'/',"test.err");
    assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_nodump.c"
                    ,L'0',"..");
    return;
  }
  skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_nodump.c"
                 ,L'\r');
  test_skipping("Can\'t test nodump on this filesystem");
  return;
}

Assistant:

DEFINE_TEST(test_option_nodump)
{

	if (!canNodump()) {
		skipping("Can't test nodump on this filesystem");
		return;
	}

	assertMakeFile("file1", 0644, "file1");
	assertMakeFile("file2", 0644, "file2");
	assertMakeFile("file3", 0644, "file3");
	assertSetNodump("file2");

	/* Test 1: Without --nodump */
	assertEqualInt(0, systemf("%s -cf test1.tar file1 file2 file3",
	    testprog));
	assertMakeDir("test1", 0755);
	assertChdir("test1");
	assertEqualInt(0,
	    systemf("%s -xf ../test1.tar >test.out 2>test.err", testprog));
	assertFileContents("file1", 5, "file1");
	assertFileContents("file2", 5, "file2");
	assertFileContents("file3", 5, "file3");
	assertEmptyFile("test.out");
	assertEmptyFile("test.err");
	assertChdir("..");

	/* Test 2: With --nodump */
	assertEqualInt(0, systemf("%s -cf test2.tar --nodump file1 file2 file3",
	    testprog));
	assertMakeDir("test2", 0755);
	assertChdir("test2");
	assertEqualInt(0,
	    systemf("%s -xf ../test2.tar >test.out 2>test.err", testprog));
	assertFileContents("file1", 5, "file1");
	assertFileNotExists("file2");
	assertFileContents("file3", 5, "file3");
	assertEmptyFile("test.out");
	assertEmptyFile("test.err");
	assertChdir("..");
}